

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O0

void leopard::ff16::IFFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ushort uVar57;
  undefined1 (*pauVar58) [16];
  long lVar59;
  long in_RCX;
  ushort in_DX;
  ulong *in_RSI;
  ulong *in_RDI;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i data_0_2;
  __m128i data_1_2;
  __m128i prod_hi_2;
  __m128i prod_lo_2;
  __m128i y_hi_2;
  __m128i y_lo_2;
  __m128i x_hi_2;
  __m128i x_lo_2;
  __m128i data_0_1;
  __m128i data_1_1;
  __m128i prod_hi_1;
  __m128i prod_lo_1;
  __m128i y_hi_1;
  __m128i y_lo_1;
  __m128i x_hi_1;
  __m128i x_lo_1;
  __m128i *y16;
  __m128i *x16;
  __m128i clr_mask_1;
  __m128i T3_hi_0_1;
  __m128i T2_hi_0_1;
  __m128i T1_hi_0_1;
  __m128i T0_hi_0_1;
  __m128i T3_lo_0_1;
  __m128i T2_lo_0_1;
  __m128i T1_lo_0_1;
  __m128i T0_lo_0_1;
  __m256i data_0;
  __m256i data_1;
  __m256i prod_hi;
  __m256i prod_lo;
  __m256i y_hi;
  __m256i y_lo;
  __m256i x_hi;
  __m256i x_lo;
  __m256i *y32;
  __m256i *x32;
  __m256i clr_mask;
  __m256i T3_hi_0;
  __m256i T2_hi_0;
  __m256i T1_hi_0;
  __m256i T0_hi_0;
  __m256i T3_lo_0;
  __m256i T2_lo_0;
  __m256i T1_lo_0;
  __m256i T0_lo_0;
  ffe_t prod;
  uint hi;
  uint lo;
  uint i;
  uint8_t *x1;
  uint8_t *y1;
  ffe_t *lut;
  ulong local_13c0;
  ulong uStackY_13b8;
  ulong local_13b0;
  ulong uStackY_13a8;
  ulong local_1340;
  ulong uStackY_1338;
  ulong local_1330;
  ulong uStackY_1328;
  ulong *local_12e0;
  ulong *local_12d8;
  uint64_t in_stack_ffffffffffffed40;
  void *in_stack_ffffffffffffed48;
  void *in_stack_ffffffffffffed50;
  ulong local_1200;
  ulong uStack_11f8;
  ulong uStack_11f0;
  ulong uStack_11e8;
  ulong local_11e0;
  ulong uStack_11d8;
  ulong uStack_11d0;
  ulong uStack_11c8;
  ulong *local_1130;
  ulong *local_1128;
  long local_fe8;
  ulong local_ee0;
  ulong uStack_ed8;
  ulong uStack_ed0;
  ulong uStack_ec8;
  ulong local_ea0;
  ulong uStack_e98;
  ulong uStack_e90;
  ulong uStack_e88;
  ulong local_e60;
  ulong uStack_e58;
  ulong uStack_e50;
  ulong uStack_e48;
  ulong local_e20;
  ulong uStack_e18;
  ulong uStack_e10;
  ulong uStack_e08;
  ulong local_de0;
  ulong uStack_dd8;
  ulong uStack_dd0;
  ulong uStack_dc8;
  ulong local_da0;
  ulong uStack_d98;
  ulong uStack_d90;
  ulong uStack_d88;
  ulong local_7a0;
  ulong uStack_798;
  ulong local_780;
  ulong uStack_778;
  ulong local_760;
  ulong uStack_758;
  ulong local_740;
  ulong uStack_738;
  ulong local_720;
  ulong uStack_718;
  ulong local_700;
  ulong uStack_6f8;
  ulong local_660;
  ulong uStack_658;
  ulong local_640;
  ulong uStack_638;
  ulong local_620;
  ulong uStack_618;
  ulong local_600;
  ulong uStack_5f8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong local_5c0;
  ulong uStack_5b8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  uint local_6c;
  ulong *local_68;
  ulong *local_60;
  long local_50;
  
  local_fe8 = in_RCX;
  if ((CpuHasAVX2 & 1) == 0) {
    if ((CpuHasSSSE3 & 1) == 0) {
      xor_mem(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
      lVar59 = Multiply16LUT + (ulong)in_DX * 0x80;
      local_68 = in_RDI;
      local_60 = in_RSI;
      local_50 = in_RCX;
      do {
        for (local_6c = 0; local_6c < 0x20; local_6c = local_6c + 1) {
          bVar1 = *(byte *)((long)local_60 + (ulong)(local_6c + 0x20));
          uVar57 = *(ushort *)
                    (lVar59 + (ulong)(*(byte *)((long)local_60 + (ulong)local_6c) & 0xf) * 2) ^
                   *(ushort *)
                    (lVar59 + (ulong)((*(byte *)((long)local_60 + (ulong)local_6c) >> 4) + 0x10) * 2
                    ) ^ *(ushort *)(lVar59 + (ulong)((bVar1 & 0xf) + 0x20) * 2) ^
                   *(ushort *)(lVar59 + (ulong)((bVar1 >> 4) + 0x30) * 2);
          *(byte *)((long)local_68 + (ulong)local_6c) =
               *(byte *)((long)local_68 + (ulong)local_6c) ^ (byte)uVar57;
          *(byte *)((long)local_68 + (ulong)(local_6c + 0x20)) =
               *(byte *)((long)local_68 + (ulong)(local_6c + 0x20)) ^ (byte)(uVar57 >> 8);
        }
        local_68 = local_68 + 8;
        local_60 = local_60 + 8;
        local_50 = local_50 + -0x40;
      } while (local_50 != 0);
    }
    else {
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + (ulong)in_DX * 0x80);
      auVar49 = *pauVar58;
      auVar60 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x10 + (ulong)in_DX * 0x80);
      auVar51 = *pauVar58;
      auVar43 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x20 + (ulong)in_DX * 0x80);
      auVar53 = *pauVar58;
      auVar45 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x30 + (ulong)in_DX * 0x80);
      auVar55 = *pauVar58;
      auVar47 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x40 + (ulong)in_DX * 0x80);
      auVar50 = *pauVar58;
      auVar42 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x50 + (ulong)in_DX * 0x80);
      auVar52 = *pauVar58;
      auVar44 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x60 + (ulong)in_DX * 0x80);
      auVar54 = *pauVar58;
      auVar46 = *pauVar58;
      pauVar58 = (undefined1 (*) [16])(Multiply128LUT + 0x70 + (ulong)in_DX * 0x80);
      auVar56 = *pauVar58;
      auVar48 = *pauVar58;
      auVar61 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar61 = vpinsrb_avx(auVar61,0xf,2);
      auVar61 = vpinsrb_avx(auVar61,0xf,3);
      auVar61 = vpinsrb_avx(auVar61,0xf,4);
      auVar61 = vpinsrb_avx(auVar61,0xf,5);
      auVar61 = vpinsrb_avx(auVar61,0xf,6);
      auVar61 = vpinsrb_avx(auVar61,0xf,7);
      auVar61 = vpinsrb_avx(auVar61,0xf,8);
      auVar61 = vpinsrb_avx(auVar61,0xf,9);
      auVar61 = vpinsrb_avx(auVar61,0xf,10);
      auVar61 = vpinsrb_avx(auVar61,0xf,0xb);
      auVar61 = vpinsrb_avx(auVar61,0xf,0xc);
      auVar61 = vpinsrb_avx(auVar61,0xf,0xd);
      auVar61 = vpinsrb_avx(auVar61,0xf,0xe);
      auVar61 = vpinsrb_avx(auVar61,0xf,0xf);
      local_12e0 = in_RSI;
      local_12d8 = in_RDI;
      do {
        uVar8 = local_12d8[2];
        uVar9 = local_12d8[3];
        uVar10 = local_12d8[6];
        uVar11 = local_12d8[7];
        uVar12 = local_12e0[2] ^ uVar8;
        uVar13 = local_12e0[3] ^ uVar9;
        uVar14 = local_12e0[6] ^ uVar10;
        uVar15 = local_12e0[7] ^ uVar11;
        local_12e0[2] = uVar12;
        local_12e0[3] = uVar13;
        local_12e0[6] = uVar14;
        local_12e0[7] = uVar15;
        auVar29._8_8_ = uVar13;
        auVar29._0_8_ = uVar12;
        auVar4 = vpsrlq_avx(auVar29,ZEXT416(4));
        auVar33._8_8_ = uVar13;
        auVar33._0_8_ = uVar12;
        auVar2 = vpand_avx(auVar33,auVar61);
        auVar4 = vpand_avx(auVar4,auVar61);
        auVar3 = vpshufb_avx(auVar60,auVar2);
        auVar2 = vpshufb_avx(auVar42,auVar2);
        local_1330 = auVar3._0_8_;
        uStackY_1328 = auVar3._8_8_;
        auVar3 = vpshufb_avx(auVar43,auVar4);
        local_5c0 = auVar3._0_8_;
        uStack_5b8 = auVar3._8_8_;
        local_1340 = auVar2._0_8_;
        uStackY_1338 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar44,auVar4);
        local_5e0 = auVar2._0_8_;
        uStack_5d8 = auVar2._8_8_;
        auVar32._8_8_ = uVar15;
        auVar32._0_8_ = uVar14;
        auVar2 = vpand_avx(auVar32,auVar61);
        auVar3._8_8_ = uVar15;
        auVar3._0_8_ = uVar14;
        auVar4 = vpsrlq_avx(auVar3,ZEXT416(4));
        auVar4 = vpand_avx(auVar4,auVar61);
        auVar3 = vpshufb_avx(auVar45,auVar2);
        local_600 = auVar3._0_8_;
        uStack_5f8 = auVar3._8_8_;
        auVar2 = vpshufb_avx(auVar46,auVar2);
        local_620 = auVar2._0_8_;
        uStack_618 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar47,auVar4);
        local_640 = auVar2._0_8_;
        uStack_638 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar48,auVar4);
        local_660 = auVar2._0_8_;
        uStack_658 = auVar2._8_8_;
        local_12d8[2] = uVar8 ^ local_1330 ^ local_5c0 ^ local_600 ^ local_640;
        local_12d8[3] = uVar9 ^ uStackY_1328 ^ uStack_5b8 ^ uStack_5f8 ^ uStack_638;
        local_12d8[6] = uVar10 ^ local_1340 ^ local_5e0 ^ local_620 ^ local_660;
        local_12d8[7] = uVar11 ^ uStackY_1338 ^ uStack_5d8 ^ uStack_618 ^ uStack_658;
        uVar8 = *local_12d8;
        uVar9 = local_12d8[1];
        uVar10 = local_12d8[4];
        uVar11 = local_12d8[5];
        uVar12 = *local_12e0 ^ uVar8;
        uVar13 = local_12e0[1] ^ uVar9;
        uVar14 = local_12e0[4] ^ uVar10;
        uVar15 = local_12e0[5] ^ uVar11;
        *local_12e0 = uVar12;
        local_12e0[1] = uVar13;
        local_12e0[4] = uVar14;
        local_12e0[5] = uVar15;
        auVar2._8_8_ = uVar13;
        auVar2._0_8_ = uVar12;
        auVar4 = vpsrlq_avx(auVar2,ZEXT416(4));
        auVar31._8_8_ = uVar13;
        auVar31._0_8_ = uVar12;
        auVar2 = vpand_avx(auVar31,auVar61);
        auVar4 = vpand_avx(auVar4,auVar61);
        auVar3 = vpshufb_avx(auVar49,auVar2);
        auVar2 = vpshufb_avx(auVar50,auVar2);
        local_13b0 = auVar3._0_8_;
        uStackY_13a8 = auVar3._8_8_;
        auVar3 = vpshufb_avx(auVar51,auVar4);
        local_700 = auVar3._0_8_;
        uStack_6f8 = auVar3._8_8_;
        local_13c0 = auVar2._0_8_;
        uStackY_13b8 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar52,auVar4);
        local_720 = auVar2._0_8_;
        uStack_718 = auVar2._8_8_;
        auVar30._8_8_ = uVar15;
        auVar30._0_8_ = uVar14;
        auVar2 = vpand_avx(auVar30,auVar61);
        auVar4._8_8_ = uVar15;
        auVar4._0_8_ = uVar14;
        auVar4 = vpsrlq_avx(auVar4,ZEXT416(4));
        auVar4 = vpand_avx(auVar4,auVar61);
        auVar3 = vpshufb_avx(auVar53,auVar2);
        local_740 = auVar3._0_8_;
        uStack_738 = auVar3._8_8_;
        auVar2 = vpshufb_avx(auVar54,auVar2);
        local_760 = auVar2._0_8_;
        uStack_758 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar55,auVar4);
        local_780 = auVar2._0_8_;
        uStack_778 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar56,auVar4);
        local_7a0 = auVar2._0_8_;
        uStack_798 = auVar2._8_8_;
        *local_12d8 = uVar8 ^ local_13b0 ^ local_700 ^ local_740 ^ local_780;
        local_12d8[1] = uVar9 ^ uStackY_13a8 ^ uStack_6f8 ^ uStack_738 ^ uStack_778;
        local_12d8[4] = uVar10 ^ local_13c0 ^ local_720 ^ local_760 ^ local_7a0;
        local_12d8[5] = uVar11 ^ uStackY_13b8 ^ uStack_718 ^ uStack_758 ^ uStack_798;
        local_12d8 = local_12d8 + 8;
        local_12e0 = local_12e0 + 8;
        local_fe8 = local_fe8 + -0x40;
      } while (local_fe8 != 0);
    }
  }
  else {
    auVar34 = *(undefined1 (*) [32])(Multiply256LUT + (ulong)in_DX * 0x100);
    auVar36 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + (ulong)in_DX * 0x100);
    auVar38 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + (ulong)in_DX * 0x100);
    auVar40 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + (ulong)in_DX * 0x100);
    auVar35 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + (ulong)in_DX * 0x100);
    auVar37 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + (ulong)in_DX * 0x100);
    auVar39 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + (ulong)in_DX * 0x100);
    auVar41 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + (ulong)in_DX * 0x100);
    auVar61 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar61 = vpinsrb_avx(auVar61,0xf,2);
    auVar61 = vpinsrb_avx(auVar61,0xf,3);
    auVar61 = vpinsrb_avx(auVar61,0xf,4);
    auVar61 = vpinsrb_avx(auVar61,0xf,5);
    auVar61 = vpinsrb_avx(auVar61,0xf,6);
    auVar61 = vpinsrb_avx(auVar61,0xf,7);
    auVar61 = vpinsrb_avx(auVar61,0xf,8);
    auVar61 = vpinsrb_avx(auVar61,0xf,9);
    auVar61 = vpinsrb_avx(auVar61,0xf,10);
    auVar61 = vpinsrb_avx(auVar61,0xf,0xb);
    auVar61 = vpinsrb_avx(auVar61,0xf,0xc);
    auVar61 = vpinsrb_avx(auVar61,0xf,0xd);
    auVar61 = vpinsrb_avx(auVar61,0xf,0xe);
    auVar61 = vpinsrb_avx(auVar61,0xf,0xf);
    auVar60 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar60 = vpinsrb_avx(auVar60,0xf,2);
    auVar60 = vpinsrb_avx(auVar60,0xf,3);
    auVar60 = vpinsrb_avx(auVar60,0xf,4);
    auVar60 = vpinsrb_avx(auVar60,0xf,5);
    auVar60 = vpinsrb_avx(auVar60,0xf,6);
    auVar60 = vpinsrb_avx(auVar60,0xf,7);
    auVar60 = vpinsrb_avx(auVar60,0xf,8);
    auVar60 = vpinsrb_avx(auVar60,0xf,9);
    auVar60 = vpinsrb_avx(auVar60,0xf,10);
    auVar60 = vpinsrb_avx(auVar60,0xf,0xb);
    auVar60 = vpinsrb_avx(auVar60,0xf,0xc);
    auVar60 = vpinsrb_avx(auVar60,0xf,0xd);
    auVar60 = vpinsrb_avx(auVar60,0xf,0xe);
    auVar60 = vpinsrb_avx(auVar60,0xf,0xf);
    auVar60 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
    auVar61 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
    uStack_d0 = auVar61._0_8_;
    uStack_c8 = auVar61._8_8_;
    local_1130 = in_RSI;
    local_1128 = in_RDI;
    do {
      uVar8 = *local_1128;
      uVar9 = local_1128[1];
      uVar10 = local_1128[2];
      uVar11 = local_1128[3];
      uVar12 = local_1128[4];
      uVar13 = local_1128[5];
      uVar14 = local_1128[6];
      uVar15 = local_1128[7];
      uVar16 = *local_1130 ^ uVar8;
      uVar17 = local_1130[1] ^ uVar9;
      uVar18 = local_1130[2] ^ uVar10;
      uVar19 = local_1130[3] ^ uVar11;
      uVar20 = local_1130[4] ^ uVar12;
      uVar21 = local_1130[5] ^ uVar13;
      uVar22 = local_1130[6] ^ uVar14;
      uVar23 = local_1130[7] ^ uVar15;
      *local_1130 = uVar16;
      local_1130[1] = uVar17;
      local_1130[2] = uVar18;
      local_1130[3] = uVar19;
      local_1130[4] = uVar20;
      local_1130[5] = uVar21;
      local_1130[6] = uVar22;
      local_1130[7] = uVar23;
      auVar5._8_8_ = uVar17;
      auVar5._0_8_ = uVar16;
      auVar5._16_8_ = uVar18;
      auVar5._24_8_ = uVar19;
      auVar7 = vpsrlq_avx2(auVar5,ZEXT416(4));
      auVar28._8_8_ = uVar17;
      auVar28._0_8_ = uVar16;
      auVar28._16_8_ = uVar18;
      auVar28._24_8_ = uVar19;
      auVar27._16_8_ = uStack_d0;
      auVar27._0_16_ = auVar60;
      auVar27._24_8_ = uStack_c8;
      auVar5 = vpand_avx2(auVar28,auVar27);
      auVar26._16_8_ = uStack_d0;
      auVar26._0_16_ = auVar60;
      auVar26._24_8_ = uStack_c8;
      auVar7 = vpand_avx2(auVar7,auVar26);
      auVar6 = vpshufb_avx2(auVar34,auVar5);
      auVar5 = vpshufb_avx2(auVar35,auVar5);
      local_11e0 = auVar6._0_8_;
      uStack_11d8 = auVar6._8_8_;
      uStack_11d0 = auVar6._16_8_;
      uStack_11c8 = auVar6._24_8_;
      auVar6 = vpshufb_avx2(auVar36,auVar7);
      local_da0 = auVar6._0_8_;
      uStack_d98 = auVar6._8_8_;
      uStack_d90 = auVar6._16_8_;
      uStack_d88 = auVar6._24_8_;
      local_1200 = auVar5._0_8_;
      uStack_11f8 = auVar5._8_8_;
      uStack_11f0 = auVar5._16_8_;
      uStack_11e8 = auVar5._24_8_;
      auVar5 = vpshufb_avx2(auVar37,auVar7);
      local_de0 = auVar5._0_8_;
      uStack_dd8 = auVar5._8_8_;
      uStack_dd0 = auVar5._16_8_;
      uStack_dc8 = auVar5._24_8_;
      auVar25._8_8_ = uVar21;
      auVar25._0_8_ = uVar20;
      auVar25._16_8_ = uVar22;
      auVar25._24_8_ = uVar23;
      auVar24._16_8_ = uStack_d0;
      auVar24._0_16_ = auVar60;
      auVar24._24_8_ = uStack_c8;
      auVar5 = vpand_avx2(auVar25,auVar24);
      auVar7._8_8_ = uVar21;
      auVar7._0_8_ = uVar20;
      auVar7._16_8_ = uVar22;
      auVar7._24_8_ = uVar23;
      auVar7 = vpsrlq_avx2(auVar7,ZEXT416(4));
      auVar6._16_8_ = uStack_d0;
      auVar6._0_16_ = auVar60;
      auVar6._24_8_ = uStack_c8;
      auVar7 = vpand_avx2(auVar7,auVar6);
      auVar6 = vpshufb_avx2(auVar38,auVar5);
      local_e20 = auVar6._0_8_;
      uStack_e18 = auVar6._8_8_;
      uStack_e10 = auVar6._16_8_;
      uStack_e08 = auVar6._24_8_;
      auVar5 = vpshufb_avx2(auVar39,auVar5);
      local_e60 = auVar5._0_8_;
      uStack_e58 = auVar5._8_8_;
      uStack_e50 = auVar5._16_8_;
      uStack_e48 = auVar5._24_8_;
      auVar5 = vpshufb_avx2(auVar40,auVar7);
      local_ea0 = auVar5._0_8_;
      uStack_e98 = auVar5._8_8_;
      uStack_e90 = auVar5._16_8_;
      uStack_e88 = auVar5._24_8_;
      auVar5 = vpshufb_avx2(auVar41,auVar7);
      local_ee0 = auVar5._0_8_;
      uStack_ed8 = auVar5._8_8_;
      uStack_ed0 = auVar5._16_8_;
      uStack_ec8 = auVar5._24_8_;
      *local_1128 = uVar8 ^ local_11e0 ^ local_da0 ^ local_e20 ^ local_ea0;
      local_1128[1] = uVar9 ^ uStack_11d8 ^ uStack_d98 ^ uStack_e18 ^ uStack_e98;
      local_1128[2] = uVar10 ^ uStack_11d0 ^ uStack_d90 ^ uStack_e10 ^ uStack_e90;
      local_1128[3] = uVar11 ^ uStack_11c8 ^ uStack_d88 ^ uStack_e08 ^ uStack_e88;
      local_1128[4] = uVar12 ^ local_1200 ^ local_de0 ^ local_e60 ^ local_ee0;
      local_1128[5] = uVar13 ^ uStack_11f8 ^ uStack_dd8 ^ uStack_e58 ^ uStack_ed8;
      local_1128[6] = uVar14 ^ uStack_11f0 ^ uStack_dd0 ^ uStack_e50 ^ uStack_ed0;
      local_1128[7] = uVar15 ^ uStack_11e8 ^ uStack_dc8 ^ uStack_e48 ^ uStack_ec8;
      local_1130 = local_1130 + 8;
      local_1128 = local_1128 + 8;
      local_fe8 = local_fe8 + -0x40;
    } while (local_fe8 != 0);
  }
  return;
}

Assistant:

static void IFFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_IFFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); }

            LEO_IFFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_IFFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); }

            LEO_IFFTB_128(x16 + 1, y16 + 1);
            LEO_IFFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    xor_mem(y, x, bytes);
    RefMulAdd(x, y, log_m, bytes);
}